

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_VerifyFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  MacAlgorithm *pMVar3;
  undefined4 extraout_var;
  CK_RV CVar4;
  ByteString local_58;
  
  CVar4 = 400;
  if (this->isInitialised == true) {
    if (pSignature == (CK_BYTE_PTR)0x0) {
      CVar4 = 7;
    }
    else {
      this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_00 == (Session *)0x0) {
        CVar4 = 0xb3;
      }
      else {
        iVar2 = Session::getOpType(this_00);
        CVar4 = 0x91;
        if (iVar2 == 6) {
          bVar1 = Session::getAllowMultiPartOp(this_00);
          if (bVar1) {
            pMVar3 = Session::getMacOp(this_00);
            if (pMVar3 == (MacAlgorithm *)0x0) {
              CVar4 = AsymVerifyFinal(this_00,pSignature,ulSignatureLen);
              return CVar4;
            }
            pMVar3 = Session::getMacOp(this_00);
            if (pMVar3 == (MacAlgorithm *)0x0) {
              Session::resetOp(this_00);
            }
            else {
              iVar2 = (*pMVar3->_vptr_MacAlgorithm[0xb])(pMVar3);
              if (CONCAT44(extraout_var,iVar2) == ulSignatureLen) {
                ByteString::ByteString(&local_58,pSignature,ulSignatureLen);
                iVar2 = (*pMVar3->_vptr_MacAlgorithm[7])(pMVar3,&local_58);
                Session::resetOp(this_00);
                CVar4 = 0xc0;
                if ((char)iVar2 != '\0') {
                  CVar4 = 0;
                }
                local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                          (&local_58.byteString.
                            super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
              }
              else {
                softHSMLog(3,"MacVerifyFinal",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x164b,
                           "The size of the signature differs from the size of the mechanism");
                Session::resetOp(this_00);
                CVar4 = 0xc1;
              }
            }
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_VerifyFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pSignature == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_VERIFY || !session->getAllowMultiPartOp())
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacVerifyFinal(session, pSignature, ulSignatureLen);
	else
		return AsymVerifyFinal(session, pSignature, ulSignatureLen);
}